

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse41_128_32.c
# Opt level: O0

parasail_result_t *
parasail_nw_stats_rowcol_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  parasail_matrix_t *ppVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  longlong lVar12;
  __m128i *palVar13;
  longlong lVar14;
  longlong lVar15;
  longlong lVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  longlong lVar23;
  longlong lVar24;
  longlong lVar25;
  longlong lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int32_t *ptr_06;
  __m128i *palVar74;
  __m128i *palVar75;
  __m128i *palVar76;
  undefined8 *puVar77;
  uint uVar78;
  int32_t t;
  int iVar79;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  int seglen;
  int iVar80;
  uint uVar88;
  ulong uVar81;
  long lVar82;
  long lVar83;
  long lVar84;
  int iVar89;
  long lVar85;
  long lVar86;
  long lVar87;
  uint uVar90;
  int iVar91;
  uint uVar92;
  uint uVar93;
  uint uVar95;
  ulong uVar94;
  int iVar96;
  uint uVar97;
  uint uVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  __m128i vH_03;
  int local_1540;
  int local_1538;
  int local_152c;
  ulong uStack_1528;
  __m128i vHL_2;
  __m128i vHS_2;
  __m128i vHM_2;
  __m128i vH_2;
  __m128i vHL_1;
  __m128i vHS_1;
  __m128i vHM_1;
  __m128i vH_1;
  __m128i vFtL;
  __m128i vFtS;
  __m128i vFtM;
  __m128i vFt;
  __m128i vGapperL_1;
  __m128i vGapper_1;
  __m128i case2;
  __m128i case1;
  __m128i vWS;
  __m128i *pvWS;
  __m128i vWM;
  __m128i *pvWM;
  __m128i vW;
  __m128i *pvW;
  __m128i vHpL;
  __m128i vHpS;
  __m128i vHpM;
  __m128i vHp;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_opn;
  __m128i vF_ext;
  __m128i vF;
  __m128i vHtL;
  __m128i vHtS;
  __m128i vHtM;
  __m128i vHt;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_opn;
  __m128i vE_ext;
  __m128i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_32_t h;
  int local_1220;
  int local_121c;
  int32_t segNum;
  int32_t index;
  __m128i vGapperL;
  __m128i vGapper;
  parasail_result_t *result;
  __m128i vSegLen;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int32_t length;
  int32_t similar;
  int32_t matches;
  int32_t score;
  __m128i vOne;
  __m128i vZero;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int32_t *boundary;
  __m128i *pvGapperL;
  __m128i *pvGapper;
  __m128i *pvHLMax;
  __m128i *pvHSMax;
  __m128i *pvHMMax;
  __m128i *pvHMax;
  __m128i *pvHL;
  __m128i *pvHS;
  __m128i *pvHM;
  __m128i *pvH;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvPs;
  __m128i *pvPm;
  __m128i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_1060;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  int local_fe8;
  int iStack_fe4;
  int iStack_fe0;
  int iStack_fdc;
  int iStack_fa4;
  int iStack_fa0;
  int iStack_f9c;
  int iStack_f84;
  int iStack_f80;
  int iStack_f7c;
  undefined4 local_f78;
  int iStack_f74;
  int iStack_f70;
  int iStack_f6c;
  int local_f58;
  int iStack_f54;
  int iStack_f50;
  int iStack_f4c;
  int local_f28;
  int iStack_f24;
  int iStack_f20;
  int iStack_f1c;
  int local_f18;
  int iStack_f14;
  int iStack_f10;
  int iStack_f0c;
  int local_f08;
  int iStack_f04;
  int iStack_f00;
  int iStack_efc;
  int local_ef8;
  int iStack_ef4;
  int iStack_ef0;
  int iStack_eec;
  int local_ee8;
  int iStack_ee4;
  int iStack_ee0;
  int iStack_edc;
  int local_ed8;
  int iStack_ed4;
  int iStack_ed0;
  int iStack_ecc;
  int local_ec8;
  int iStack_ec4;
  int iStack_ec0;
  int iStack_ebc;
  int local_eb8;
  int iStack_eb4;
  int iStack_eb0;
  int iStack_eac;
  int local_ea8;
  int iStack_ea4;
  int iStack_ea0;
  int iStack_e9c;
  int local_e98;
  int iStack_e94;
  int iStack_e90;
  int iStack_e8c;
  int local_e88;
  int iStack_e84;
  int iStack_e80;
  int iStack_e7c;
  int local_e68;
  int iStack_e64;
  int iStack_e60;
  int iStack_e5c;
  int local_e48;
  int iStack_e44;
  int iStack_e40;
  int iStack_e3c;
  int local_e08;
  int iStack_e04;
  int iStack_e00;
  int iStack_dfc;
  int local_de8;
  int iStack_de4;
  int iStack_de0;
  int iStack_ddc;
  int local_dc8;
  int iStack_dc4;
  int iStack_dc0;
  int iStack_dbc;
  int local_da8;
  int iStack_da4;
  int iStack_da0;
  int iStack_d9c;
  int local_d98;
  int iStack_d94;
  int iStack_d90;
  int iStack_d8c;
  int local_a18;
  int iStack_a14;
  int iStack_a10;
  int iStack_a0c;
  int iStack_9bc;
  int local_908;
  int iStack_904;
  int iStack_900;
  int iStack_8fc;
  int local_8e8;
  int iStack_8e4;
  int iStack_8e0;
  int iStack_8dc;
  int local_8b8;
  int iStack_8b4;
  int iStack_8b0;
  int iStack_8ac;
  int local_888;
  int iStack_884;
  int iStack_880;
  int iStack_87c;
  uint local_878;
  uint uStack_874;
  uint uStack_870;
  uint uStack_86c;
  int local_7b8;
  int iStack_7b4;
  int iStack_7b0;
  int iStack_7ac;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  size_t len;
  
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_scan_profile_sse41_128_32",
            "profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile32).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_scan_profile_sse41_128_32",
            "profile->profile32.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_scan_profile_sse41_128_32",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_rowcol_scan_profile_sse41_128_32",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_scan_profile_sse41_128_32","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_rowcol_scan_profile_sse41_128_32",
            "s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_rowcol_scan_profile_sse41_128_32",
            "open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_rowcol_scan_profile_sse41_128_32",
            "gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar71 = profile->s1Len;
    local_1060 = iVar71 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar1 = profile->matrix;
    iVar70 = (iVar71 + 3) / 4;
    iVar79 = (iVar71 + -1) % iVar70;
    iVar71 = ~((iVar71 + -1) / iVar70) + 4;
    pvVar2 = (profile->profile32).score;
    pvVar3 = (profile->profile32).matches;
    pvVar4 = (profile->profile32).similar;
    if (-open < ppVar1->min) {
      local_152c = open + -0x80000000;
    }
    else {
      local_152c = -0x80000000 - ppVar1->min;
    }
    local_152c = local_152c + 1;
    iVar72 = 0x7ffffffe - ppVar1->max;
    vSaturationCheckMax[1] = CONCAT44(iVar72,iVar72);
    vSaturationCheckMin[0] = CONCAT44(iVar72,iVar72);
    iVar73 = -iVar70 * gap;
    seglen = gap;
    profile_local = (parasail_profile_t *)parasail_result_new_rowcol3(iVar70 * 4,s2Len);
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x4410401;
      uVar78 = *(uint *)&profile_local->field_0xc | 0x40000;
      len = (size_t)uVar78;
      *(uint *)&profile_local->field_0xc = uVar78;
      b = parasail_memalign___m128i(0x10,(long)iVar70);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar70);
      b_01 = parasail_memalign___m128i(0x10,(long)iVar70);
      b_02 = parasail_memalign___m128i(0x10,(long)iVar70);
      ptr = parasail_memalign___m128i(0x10,(long)iVar70);
      b_03 = parasail_memalign___m128i(0x10,(long)iVar70);
      b_04 = parasail_memalign___m128i(0x10,(long)iVar70);
      b_05 = parasail_memalign___m128i(0x10,(long)iVar70);
      ptr_00 = parasail_memalign___m128i(0x10,(long)iVar70);
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar70);
      ptr_02 = parasail_memalign___m128i(0x10,(long)iVar70);
      ptr_03 = parasail_memalign___m128i(0x10,(long)iVar70);
      ptr_04 = parasail_memalign___m128i(0x10,(long)iVar70);
      ptr_05 = parasail_memalign___m128i(0x10,(long)iVar70);
      ptr_06 = parasail_memalign_int32_t(0x10,(long)(s2Len + 1));
      if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_05 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_05 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_06 == (int32_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        c[0] = (long)iVar70;
        c[1] = extraout_RDX;
        parasail_memset___m128i(b_03,c,len);
        c_00[0] = (long)iVar70;
        c_00[1] = extraout_RDX_00;
        parasail_memset___m128i(b_04,c_00,len);
        c_01[0] = (long)iVar70;
        c_01[1] = extraout_RDX_01;
        parasail_memset___m128i(b_05,c_01,len);
        c_02[0] = (long)iVar70;
        c_02[1] = extraout_RDX_02;
        parasail_memset___m128i(b,c_02,len);
        c_03[0] = (long)iVar70;
        c_03[1] = extraout_RDX_03;
        parasail_memset___m128i(b_00,c_03,len);
        c_04[0] = (long)iVar70;
        c_04[1] = extraout_RDX_04;
        parasail_memset___m128i(b_01,c_04,len);
        c_05[0] = (long)iVar70;
        c_05[1] = extraout_RDX_05;
        parasail_memset___m128i(b_02,c_05,len);
        vGapperL[1]._0_4_ = -open;
        vGapperL[1]._4_4_ = -open;
        vGapper[0]._0_4_ = -open;
        vGapper[0]._4_4_ = -open;
        _segNum = 0x100000001;
        vGapperL[0] = 0x100000001;
        k = iVar70;
        while (k = k + -1, -1 < k) {
          ptr_04[k][0] = CONCAT44(vGapperL[1]._4_4_,(int)vGapperL[1]);
          ptr_04[k][1] = CONCAT44(vGapper[0]._4_4_,(int)vGapper[0]);
          ptr_05[k][0] = _segNum;
          ptr_05[k][1] = vGapperL[0];
          vGapperL[1]._0_4_ = (int)vGapperL[1] - gap;
          vGapperL[1]._4_4_ = vGapperL[1]._4_4_ - gap;
          vGapper[0]._0_4_ = (int)vGapper[0] - gap;
          vGapper[0]._4_4_ = vGapper[0]._4_4_ - gap;
          local_e48 = (int)_segNum;
          iStack_e44 = (int)((ulong)_segNum >> 0x20);
          iStack_e40 = (int)vGapperL[0];
          iStack_e3c = (int)((ulong)vGapperL[0] >> 0x20);
          _segNum = CONCAT44(iStack_e44 + 1,local_e48 + 1);
          vGapperL[0] = CONCAT44(iStack_e3c + 1,iStack_e40 + 1);
        }
        local_121c = 0;
        for (k = 0; k < iVar70; k = k + 1) {
          for (local_1220 = 0; local_1220 < 4; local_1220 = local_1220 + 1) {
            local_1538 = -(gap * (local_1220 * iVar70 + k)) - open;
            if (local_1538 < -0x80000000) {
              local_1538 = -0x80000000;
            }
            *(int *)((long)&tmp + (long)local_1220 * 4) = local_1538;
          }
          ptr[local_121c][0] = tmp;
          ptr[local_121c][1] = h.m[0];
          local_121c = local_121c + 1;
        }
        *ptr_06 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          local_1540 = -(gap * (k + -1)) - open;
          if (local_1540 < -0x80000000) {
            local_1540 = -0x80000000;
          }
          ptr_06[k] = local_1540;
        }
        vNegInfFront[1] = CONCAT44(local_152c,local_152c);
        vSaturationCheckMax[0] = CONCAT44(local_152c,local_152c);
        for (s1Len = 0; s1Len < s2Len; s1Len = s1Len + 1) {
          uVar81 = ptr[iVar70 + -1][0];
          uVar94 = b_03[iVar70 + -1][0];
          uVar5 = b_04[iVar70 + -1][0];
          uVar6 = b_05[iVar70 + -1][0];
          iVar80 = ppVar1->mapper[(byte)s2[s1Len]];
          iVar89 = ppVar1->mapper[(byte)s2[s1Len]];
          iVar91 = ppVar1->mapper[(byte)s2[s1Len]];
          local_d98 = (int)(*ptr_04)[0];
          iStack_d94 = (int)((ulong)(*ptr_04)[0] >> 0x20);
          iStack_d90 = (int)(*ptr_04)[1];
          iStack_d8c = (int)((ulong)(*ptr_04)[1] >> 0x20);
          vHtM[1] = CONCAT44(local_152c - iStack_d94,local_152c - local_d98);
          vHt[0] = CONCAT44(local_152c - iStack_d8c,local_152c - iStack_d90);
          stack0xffffffffffffecd8 = ZEXT816(0);
          stack0xffffffffffffecc8 = ZEXT816(0);
          stack0xffffffffffffecb8 = ZEXT816(0);
          k = 0;
          pvW = (__m128i *)(uVar6 << 0x20);
          vHpL[0] = b_05[iVar70 + -1][1] << 0x20 | uVar6 >> 0x20;
          vHpL[1] = uVar5 << 0x20;
          vHpS[0] = b_04[iVar70 + -1][1] << 0x20 | uVar5 >> 0x20;
          vHpS[1] = uVar94 << 0x20;
          vHpM[0] = b_03[iVar70 + -1][1] << 0x20 | uVar94 >> 0x20;
          vHpM[1] = uVar81 << 0x20 | (ulong)(uint)ptr_06[s1Len];
          vHp[0] = ptr[iVar70 + -1][1] << 0x20 | uVar81 >> 0x20;
          vF_ext[1] = CONCAT44(local_152c,local_152c);
          vF[0] = CONCAT44(local_152c,local_152c);
          while( true ) {
            local_e88 = (int)vHtM[1];
            local_7b8 = (int)vF_ext[1];
            iStack_7b4 = (int)((ulong)vF_ext[1] >> 0x20);
            iStack_7b0 = (int)vF[0];
            iStack_7ac = (int)((ulong)vF[0] >> 0x20);
            local_ea8 = (int)vF[1];
            iStack_e84 = (int)((ulong)vHtM[1] >> 0x20);
            iStack_e80 = (int)vHt[0];
            iStack_ea4 = vF[1]._4_4_;
            iStack_ea0 = (int)vF[2];
            if (iVar70 <= k) break;
            lVar7 = ptr[k][0];
            lVar8 = ptr[k][1];
            palVar74 = b_03 + k;
            lVar9 = (*palVar74)[0];
            lVar10 = (*palVar74)[1];
            palVar75 = b_04 + k;
            lVar11 = (*palVar75)[0];
            lVar12 = (*palVar75)[1];
            palVar76 = b_05 + k;
            palVar13 = (__m128i *)(*palVar76)[0];
            lVar14 = (*palVar76)[1];
            lVar15 = b[k][0];
            lVar16 = b[k][1];
            puVar77 = (undefined8 *)((long)pvVar2 + (long)k * 0x10 + (long)(iVar80 * iVar70) * 0x10)
            ;
            uVar17 = *puVar77;
            uVar18 = puVar77[1];
            puVar77 = (undefined8 *)((long)pvVar3 + (long)k * 0x10 + (long)(iVar89 * iVar70) * 0x10)
            ;
            uVar19 = *puVar77;
            uVar20 = puVar77[1];
            puVar77 = (undefined8 *)((long)pvVar4 + (long)k * 0x10 + (long)(iVar91 * iVar70) * 0x10)
            ;
            uVar21 = *puVar77;
            uVar22 = puVar77[1];
            lVar23 = ptr_04[k][0];
            lVar24 = ptr_04[k][1];
            lVar25 = ptr_05[k][0];
            lVar26 = ptr_05[k][1];
            local_da8 = (int)lVar7;
            iStack_da4 = (int)((ulong)lVar7 >> 0x20);
            iStack_da0 = (int)lVar8;
            iStack_d9c = (int)((ulong)lVar8 >> 0x20);
            local_da8 = local_da8 - open;
            iStack_da4 = iStack_da4 - open;
            iStack_da0 = iStack_da0 - open;
            iStack_d9c = iStack_d9c - open;
            local_dc8 = (int)lVar15;
            iStack_dc4 = (int)((ulong)lVar15 >> 0x20);
            iStack_dc0 = (int)lVar16;
            iStack_dbc = (int)((ulong)lVar16 >> 0x20);
            local_dc8 = local_dc8 - gap;
            iStack_dc4 = iStack_dc4 - gap;
            iStack_dc0 = iStack_dc0 - gap;
            iStack_dbc = iStack_dbc - gap;
            case2[1] = CONCAT44(-(uint)(iStack_dc4 < iStack_da4),-(uint)(local_dc8 < local_da8));
            case1[0] = CONCAT44(-(uint)(iStack_dbc < iStack_d9c),-(uint)(iStack_dc0 < iStack_da0));
            uVar78 = (uint)(local_da8 < local_dc8) * local_dc8 |
                     (uint)(local_da8 >= local_dc8) * local_da8;
            uVar88 = (uint)(iStack_da4 < iStack_dc4) * iStack_dc4 |
                     (uint)(iStack_da4 >= iStack_dc4) * iStack_da4;
            uVar90 = (uint)(iStack_da0 < iStack_dc0) * iStack_dc0 |
                     (uint)(iStack_da0 >= iStack_dc0) * iStack_da0;
            uVar95 = (uint)(iStack_d9c < iStack_dbc) * iStack_dbc |
                     (uint)(iStack_d9c >= iStack_dbc) * iStack_d9c;
            vE_ext[1] = CONCAT44(uVar88,uVar78);
            vE[0] = CONCAT44(uVar95,uVar90);
            auVar67._8_8_ = case1[0];
            auVar67._0_8_ = case2[1];
            auVar99 = pblendvb((undefined1  [16])b_00[k],(undefined1  [16])*palVar74,auVar67);
            auVar66._8_8_ = case1[0];
            auVar66._0_8_ = case2[1];
            auVar100 = pblendvb((undefined1  [16])b_01[k],(undefined1  [16])*palVar75,auVar66);
            auVar65._8_8_ = case1[0];
            auVar65._0_8_ = case2[1];
            auVar101 = pblendvb((undefined1  [16])b_02[k],(undefined1  [16])*palVar76,auVar65);
            local_e68 = auVar101._0_4_;
            iStack_e64 = auVar101._4_4_;
            iStack_e60 = auVar101._8_4_;
            iStack_e5c = auVar101._12_4_;
            vHt[1] = CONCAT44(iStack_e64 + 1,local_e68 + 1);
            vEL[0]._0_4_ = iStack_e60 + 1;
            vEL[0]._4_4_ = iStack_e5c + 1;
            iStack_e7c = (int)((ulong)vHt[0] >> 0x20);
            local_e98 = (int)lVar23;
            iStack_e94 = (int)((ulong)lVar23 >> 0x20);
            iStack_e90 = (int)lVar24;
            iStack_e8c = (int)((ulong)lVar24 >> 0x20);
            local_e88 = local_e88 + local_e98;
            iStack_e84 = iStack_e84 + iStack_e94;
            iStack_e80 = iStack_e80 + iStack_e90;
            iStack_e7c = iStack_e7c + iStack_e8c;
            uVar81 = CONCAT44(-(uint)(iStack_e84 < iStack_7b4),-(uint)(local_e88 < local_7b8)) |
                     CONCAT44(-(uint)(iStack_7b4 == iStack_e84),-(uint)(local_7b8 == local_e88));
            uVar94 = CONCAT44(-(uint)(iStack_e7c < iStack_7ac),-(uint)(iStack_e80 < iStack_7b0)) |
                     CONCAT44(-(uint)(iStack_7ac == iStack_e7c),-(uint)(iStack_7b0 == iStack_e80));
            vF_ext[1] = CONCAT44((uint)(iStack_7b4 < iStack_e84) * iStack_e84 |
                                 (uint)(iStack_7b4 >= iStack_e84) * iStack_7b4,
                                 (uint)(local_7b8 < local_e88) * local_e88 |
                                 (uint)(local_7b8 >= local_e88) * local_7b8);
            vF[0] = CONCAT44((uint)(iStack_7ac < iStack_e7c) * iStack_e7c |
                             (uint)(iStack_7ac >= iStack_e7c) * iStack_7ac,
                             (uint)(iStack_7b0 < iStack_e80) * iStack_e80 |
                             (uint)(iStack_7b0 >= iStack_e80) * iStack_7b0);
            auVar64._8_8_ = uVar94;
            auVar64._0_8_ = uVar81;
            register0x00001240 = pblendvb(stack0xffffffffffffed38,stack0xffffffffffffecd8,auVar64);
            auVar63._8_8_ = uVar94;
            auVar63._0_8_ = uVar81;
            register0x00001240 = pblendvb(stack0xffffffffffffed28,stack0xffffffffffffecc8,auVar63);
            iStack_e9c = vF[2]._4_4_;
            local_eb8 = (int)lVar25;
            iStack_eb4 = (int)((ulong)lVar25 >> 0x20);
            iStack_eb0 = (int)lVar26;
            iStack_eac = (int)((ulong)lVar26 >> 0x20);
            auVar62._4_4_ = iStack_ea4 + iStack_eb4;
            auVar62._0_4_ = local_ea8 + local_eb8;
            auVar62._8_4_ = iStack_ea0 + iStack_eb0;
            auVar62._12_4_ = iStack_e9c + iStack_eac;
            auVar61._8_8_ = uVar94;
            auVar61._0_8_ = uVar81;
            register0x00001240 = pblendvb(auVar62,stack0xffffffffffffecb8,auVar61);
            local_ec8 = (int)vHpM[1];
            iStack_ec4 = (int)((ulong)vHpM[1] >> 0x20);
            iStack_ec0 = (int)vHp[0];
            iStack_ebc = (int)((ulong)vHp[0] >> 0x20);
            local_ed8 = (int)uVar17;
            iStack_ed4 = (int)((ulong)uVar17 >> 0x20);
            iStack_ed0 = (int)uVar18;
            iStack_ecc = (int)((ulong)uVar18 >> 0x20);
            local_ec8 = local_ec8 + local_ed8;
            iStack_ec4 = iStack_ec4 + iStack_ed4;
            iStack_ec0 = iStack_ec0 + iStack_ed0;
            iStack_ebc = iStack_ebc + iStack_ecc;
            vHpM[1] = CONCAT44(iStack_ec4,local_ec8);
            vHp[0] = CONCAT44(iStack_ebc,iStack_ec0);
            local_ee8 = (int)vHpS[1];
            iStack_ee4 = (int)((ulong)vHpS[1] >> 0x20);
            iStack_ee0 = (int)vHpM[0];
            iStack_edc = (int)((ulong)vHpM[0] >> 0x20);
            local_ef8 = (int)uVar19;
            iStack_ef4 = (int)((ulong)uVar19 >> 0x20);
            iStack_ef0 = (int)uVar20;
            iStack_eec = (int)((ulong)uVar20 >> 0x20);
            vHpS[1] = CONCAT44(iStack_ee4 + iStack_ef4,local_ee8 + local_ef8);
            vHpM[0] = CONCAT44(iStack_edc + iStack_eec,iStack_ee0 + iStack_ef0);
            local_f08 = (int)vHpL[1];
            iStack_f04 = (int)((ulong)vHpL[1] >> 0x20);
            iStack_f00 = (int)vHpS[0];
            iStack_efc = (int)((ulong)vHpS[0] >> 0x20);
            local_f18 = (int)uVar21;
            iStack_f14 = (int)((ulong)uVar21 >> 0x20);
            iStack_f10 = (int)uVar22;
            iStack_f0c = (int)((ulong)uVar22 >> 0x20);
            vHpL[1] = CONCAT44(iStack_f04 + iStack_f14,local_f08 + local_f18);
            vHpS[0] = CONCAT44(iStack_efc + iStack_f0c,iStack_f00 + iStack_f10);
            local_f28 = (int)pvW;
            iStack_f24 = (int)((ulong)pvW >> 0x20);
            iStack_f20 = (int)vHpL[0];
            iStack_f1c = (int)((ulong)vHpL[0] >> 0x20);
            pvW = (__m128i *)CONCAT44(iStack_f24 + 1,local_f28 + 1);
            vHpL[0] = CONCAT44(iStack_f1c + 1,iStack_f20 + 1);
            case2[1] = CONCAT44(-(uint)(iStack_ec4 < (int)uVar88),-(uint)(local_ec8 < (int)uVar78));
            case1[0] = CONCAT44(-(uint)(iStack_ebc < (int)uVar95),-(uint)(iStack_ec0 < (int)uVar90))
            ;
            vHtM[1] = CONCAT44((uint)((int)uVar88 < iStack_ec4) * iStack_ec4 |
                               ((int)uVar88 >= iStack_ec4) * uVar88,
                               (uint)((int)uVar78 < local_ec8) * local_ec8 |
                               ((int)uVar78 >= local_ec8) * uVar78);
            vHt[0] = CONCAT44((uint)((int)uVar95 < iStack_ebc) * iStack_ebc |
                              ((int)uVar95 >= iStack_ebc) * uVar95,
                              (uint)((int)uVar90 < iStack_ec0) * iStack_ec0 |
                              ((int)uVar90 >= iStack_ec0) * uVar90);
            vES[1] = auVar99._0_8_;
            vEM[0] = auVar99._8_8_;
            auVar60._8_8_ = vHpM[0];
            auVar60._0_8_ = vHpS[1];
            auVar59._8_8_ = case1[0];
            auVar59._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar60,auVar99,auVar59);
            vEL[1] = auVar100._0_8_;
            vES[0] = auVar100._8_8_;
            auVar58._8_8_ = vHpS[0];
            auVar58._0_8_ = vHpL[1];
            auVar57._8_8_ = case1[0];
            auVar57._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar58,auVar100,auVar57);
            auVar56._8_8_ = vHpL[0];
            auVar56._0_8_ = pvW;
            auVar55._8_8_ = vEL[0];
            auVar55._0_8_ = vHt[1];
            auVar54._8_8_ = case1[0];
            auVar54._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar56,auVar55,auVar54);
            b[k][0] = vE_ext[1];
            b[k][1] = vE[0];
            b_00[k][0] = vES[1];
            b_00[k][1] = vEM[0];
            b_01[k][0] = vEL[1];
            b_01[k][1] = vES[0];
            b_02[k][0] = vHt[1];
            b_02[k][1] = vEL[0];
            ptr[k][0] = vHpM[1];
            ptr[k][1] = vHp[0];
            b_03[k][0] = vHpS[1];
            b_03[k][1] = vHpM[0];
            b_04[k][0] = vHpL[1];
            b_04[k][1] = vHpS[0];
            b_05[k][0] = (longlong)pvW;
            b_05[k][1] = vHpL[0];
            k = k + 1;
            pvW = palVar13;
            vHpL[0] = lVar14;
            vHpL[1] = lVar11;
            vHpS[0] = lVar12;
            vHpS[1] = lVar9;
            vHpM[0] = lVar10;
            vHpM[1] = lVar7;
            vHp[0] = lVar8;
          }
          lVar82 = vHtS[1] << 0x20;
          vHtM[0] = vHtM[0] << 0x20 | (ulong)vHtS[1] >> 0x20;
          vHtS[1] = lVar82;
          lVar83 = vHtL[1] << 0x20;
          vHtS[0] = vHtS[0] << 0x20 | (ulong)vHtL[1] >> 0x20;
          vHtL[1] = lVar83;
          lVar84 = vF[1] << 0x20;
          vHtL[0] = vHtL[0] << 0x20 | (ulong)vF[1] >> 0x20;
          vF[1] = lVar84;
          iVar80 = ptr_06[(long)s1Len + 1];
          local_f58 = (int)(*ptr_04)[0];
          iStack_f54 = (int)((ulong)(*ptr_04)[0] >> 0x20);
          iStack_f50 = (int)(*ptr_04)[1];
          iStack_f4c = (int)((ulong)(*ptr_04)[1] >> 0x20);
          local_f58 = iVar80 + local_f58;
          iStack_f54 = local_e88 + iStack_f54;
          iStack_f50 = iStack_e84 + iStack_f50;
          iStack_f4c = iStack_e80 + iStack_f4c;
          uVar81 = CONCAT44(-(uint)(iStack_7b4 < iStack_f54),-(uint)(local_7b8 < local_f58)) |
                   CONCAT44(-(uint)(iStack_f54 == iStack_7b4),-(uint)(local_f58 == local_7b8));
          uVar94 = CONCAT44(-(uint)(iStack_7ac < iStack_f4c),-(uint)(iStack_7b0 < iStack_f50)) |
                   CONCAT44(-(uint)(iStack_f4c == iStack_7ac),-(uint)(iStack_f50 == iStack_7b0));
          vF_ext[1] = CONCAT44((uint)(iStack_7b4 < iStack_f54) * iStack_f54 |
                               (uint)(iStack_7b4 >= iStack_f54) * iStack_7b4,
                               (uint)(local_7b8 < local_f58) * local_f58 |
                               (uint)(local_7b8 >= local_f58) * local_7b8);
          vF[0] = CONCAT44((uint)(iStack_7ac < iStack_f4c) * iStack_f4c |
                           (uint)(iStack_7ac >= iStack_f4c) * iStack_7ac,
                           (uint)(iStack_7b0 < iStack_f50) * iStack_f50 |
                           (uint)(iStack_7b0 >= iStack_f50) * iStack_7b0);
          auVar53._8_8_ = vHtM[0];
          auVar53._0_8_ = lVar82;
          auVar52._8_8_ = uVar94;
          auVar52._0_8_ = uVar81;
          register0x00001240 = pblendvb(stack0xffffffffffffecd8,auVar53,auVar52);
          auVar51._8_8_ = vHtS[0];
          auVar51._0_8_ = lVar83;
          auVar101._8_8_ = uVar94;
          auVar101._0_8_ = uVar81;
          register0x00001240 = pblendvb(stack0xffffffffffffecc8,auVar51,auVar101);
          local_f78 = (undefined4)(*ptr_05)[0];
          iStack_f74 = (int)((ulong)(*ptr_05)[0] >> 0x20);
          iStack_f70 = (int)(*ptr_05)[1];
          iStack_f6c = (int)((ulong)(*ptr_05)[1] >> 0x20);
          auVar100._4_4_ = local_ea8 + iStack_f74;
          auVar100._0_4_ = local_f78;
          auVar100._8_4_ = iStack_ea4 + iStack_f70;
          auVar100._12_4_ = iStack_ea0 + iStack_f6c;
          auVar99._8_8_ = uVar94;
          auVar99._0_8_ = uVar81;
          register0x00001240 = pblendvb(stack0xffffffffffffecb8,auVar100,auVar99);
          k = 0;
          while( true ) {
            iStack_f84 = (int)vF_ext[1];
            iStack_f80 = (int)((ulong)vF_ext[1] >> 0x20);
            iStack_f7c = (int)vF[0];
            if (1 < k) break;
            iVar89 = iStack_f84 + iVar73;
            iVar91 = iStack_f80 + iVar73;
            iVar96 = iStack_f7c + iVar73;
            iStack_9bc = (int)((ulong)vF[0] >> 0x20);
            uVar81 = CONCAT44(-(uint)(iStack_f80 < iVar89),-(uint)(iStack_f84 < local_152c)) |
                     CONCAT44(-(uint)(iVar89 == iStack_f80),-(uint)(local_152c == iStack_f84));
            uVar94 = CONCAT44(-(uint)(iStack_9bc < iVar96),-(uint)(iStack_f7c < iVar91)) |
                     CONCAT44(-(uint)(iVar96 == iStack_9bc),-(uint)(iVar91 == iStack_f7c));
            vF_ext[1] = CONCAT44((uint)(iStack_f80 < iVar89) * iVar89 |
                                 (uint)(iStack_f80 >= iVar89) * iStack_f80,
                                 (uint)(iStack_f84 < local_152c) * local_152c |
                                 (uint)(iStack_f84 >= local_152c) * iStack_f84);
            vF[0] = CONCAT44((uint)(iStack_9bc < iVar96) * iVar96 |
                             (uint)(iStack_9bc >= iVar96) * iStack_9bc,
                             (uint)(iStack_f7c < iVar91) * iVar91 |
                             (uint)(iStack_f7c >= iVar91) * iStack_f7c);
            auVar50._8_8_ = vFM[0] << 0x20 | (ulong)vFS[1] >> 0x20;
            auVar50._0_8_ = vFS[1] << 0x20;
            auVar49._8_8_ = uVar94;
            auVar49._0_8_ = uVar81;
            register0x00001240 = pblendvb(stack0xffffffffffffecd8,auVar50,auVar49);
            auVar48._8_8_ = vFS[0] << 0x20 | (ulong)vFL[1] >> 0x20;
            auVar48._0_8_ = vFL[1] << 0x20;
            auVar47._8_8_ = uVar94;
            auVar47._0_8_ = uVar81;
            register0x00001240 = pblendvb(stack0xffffffffffffecc8,auVar48,auVar47);
            iStack_fa4 = (int)vH[1];
            iStack_fa0 = vH[1]._4_4_;
            iStack_f9c = (int)vH[2];
            auVar69._4_4_ = iStack_fa0 + iVar70;
            auVar69._0_4_ = iStack_fa4 + iVar70;
            auVar69._8_4_ = iStack_f9c + iVar70;
            auVar69._12_4_ = 0;
            auVar46._8_8_ = uVar94;
            auVar46._0_8_ = uVar81;
            register0x00001240 = pblendvb(stack0xffffffffffffecb8,auVar69 << 0x20,auVar46);
            k = k + 1;
          }
          lVar85 = vFS[1] << 0x20;
          vFM[0] = vFM[0] << 0x20 | (ulong)vFS[1] >> 0x20;
          vFS[1] = lVar85;
          lVar86 = vFL[1] << 0x20;
          vFS[0] = vFS[0] << 0x20 | (ulong)vFL[1] >> 0x20;
          vFL[1] = lVar86;
          lVar87 = vH[1] << 0x20;
          vFL[0] = vFL[0] << 0x20 | (ulong)vH[1] >> 0x20;
          vH[1] = lVar87;
          vF_ext[1] = CONCAT44(iStack_f84,local_152c);
          vF[0] = CONCAT44(iStack_f7c,iStack_f80);
          case2[1] = CONCAT44(-(uint)(local_e88 < iStack_f84),-(uint)(iVar80 < local_152c));
          case1[0] = CONCAT44(-(uint)(iStack_e80 < iStack_f7c),-(uint)(iStack_e84 < iStack_f80));
          vHM[1] = CONCAT44((uint)(iStack_f84 < local_e88) * local_e88 |
                            (uint)(iStack_f84 >= local_e88) * iStack_f84,
                            (uint)(local_152c < iVar80) * iVar80 |
                            (uint)(local_152c >= iVar80) * local_152c);
          vH[0] = CONCAT44((uint)(iStack_f7c < iStack_e80) * iStack_e80 |
                           (uint)(iStack_f7c >= iStack_e80) * iStack_f7c,
                           (uint)(iStack_f80 < iStack_e84) * iStack_e84 |
                           (uint)(iStack_f80 >= iStack_e84) * iStack_f80);
          auVar45._8_8_ = vHtM[0];
          auVar45._0_8_ = lVar82;
          auVar44._8_8_ = vFM[0];
          auVar44._0_8_ = lVar85;
          auVar43._8_8_ = case1[0];
          auVar43._0_8_ = case2[1];
          register0x00001240 = (__m128i)pblendvb(auVar45,auVar44,auVar43);
          auVar42._8_8_ = vHtS[0];
          auVar42._0_8_ = lVar83;
          auVar41._8_8_ = vFS[0];
          auVar41._0_8_ = lVar86;
          auVar40._8_8_ = case1[0];
          auVar40._0_8_ = case2[1];
          register0x00001240 = (__m128i)pblendvb(auVar42,auVar41,auVar40);
          auVar39._8_8_ = vHtL[0];
          auVar39._0_8_ = lVar84;
          auVar38._8_8_ = vFL[0];
          auVar38._0_8_ = lVar87;
          auVar37._8_8_ = case1[0];
          auVar37._0_8_ = case2[1];
          register0x00001240 = (__m128i)pblendvb(auVar39,auVar38,auVar37);
          for (k = 0; k < iVar70; k = k + 1) {
            lVar7 = ptr[k][0];
            lVar8 = ptr[k][1];
            lVar9 = b[k][0];
            lVar10 = b[k][1];
            local_de8 = (int)vHM[1];
            iStack_de4 = (int)((ulong)vHM[1] >> 0x20);
            iStack_de0 = (int)vH[0];
            iStack_ddc = (int)((ulong)vH[0] >> 0x20);
            local_de8 = local_de8 - open;
            iStack_de4 = iStack_de4 - open;
            iStack_de0 = iStack_de0 - open;
            iStack_ddc = iStack_ddc - open;
            local_e08 = (int)vF_ext[1];
            iStack_e04 = (int)((ulong)vF_ext[1] >> 0x20);
            iStack_e00 = (int)vF[0];
            iStack_dfc = (int)((ulong)vF[0] >> 0x20);
            local_e08 = local_e08 - gap;
            iStack_e04 = iStack_e04 - gap;
            iStack_e00 = iStack_e00 - gap;
            iStack_dfc = iStack_dfc - gap;
            uVar78 = (uint)(local_de8 < local_e08) * local_e08 |
                     (uint)(local_de8 >= local_e08) * local_de8;
            uVar90 = (uint)(iStack_de4 < iStack_e04) * iStack_e04 |
                     (uint)(iStack_de4 >= iStack_e04) * iStack_de4;
            uVar92 = (uint)(iStack_de0 < iStack_e00) * iStack_e00 |
                     (uint)(iStack_de0 >= iStack_e00) * iStack_de0;
            uVar97 = (uint)(iStack_ddc < iStack_dfc) * iStack_dfc |
                     (uint)(iStack_ddc >= iStack_dfc) * iStack_ddc;
            vF_ext[1] = CONCAT44(uVar90,uVar78);
            vF[0] = CONCAT44(uVar97,uVar92);
            case2[1] = CONCAT44(-(uint)(iStack_e04 < iStack_de4),-(uint)(local_e08 < local_de8));
            case1[0] = CONCAT44(-(uint)(iStack_dfc < iStack_ddc),-(uint)(iStack_e00 < iStack_de0));
            auVar36._8_8_ = case1[0];
            auVar36._0_8_ = case2[1];
            register0x00001240 =
                 pblendvb(stack0xffffffffffffecd8,(undefined1  [16])stack0xffffffffffffec98,auVar36)
            ;
            auVar35._8_8_ = case1[0];
            auVar35._0_8_ = case2[1];
            register0x00001240 =
                 pblendvb(stack0xffffffffffffecc8,(undefined1  [16])stack0xffffffffffffec88,auVar35)
            ;
            auVar34._8_8_ = case1[0];
            auVar34._0_8_ = case2[1];
            auVar99 = pblendvb(stack0xffffffffffffecb8,(undefined1  [16])stack0xffffffffffffec78,
                               auVar34);
            local_fe8 = auVar99._0_4_;
            iStack_fe4 = auVar99._4_4_;
            iStack_fe0 = auVar99._8_4_;
            iStack_fdc = auVar99._12_4_;
            vH[1] = CONCAT44(iStack_fe4 + 1,local_fe8 + 1);
            vFL[0]._0_4_ = iStack_fe0 + 1;
            vFL[0]._4_4_ = iStack_fdc + 1;
            local_878 = (uint)lVar7;
            uStack_874 = (uint)((ulong)lVar7 >> 0x20);
            uStack_870 = (uint)lVar8;
            uStack_86c = (uint)((ulong)lVar8 >> 0x20);
            local_888 = (int)lVar9;
            iStack_884 = (int)((ulong)lVar9 >> 0x20);
            iStack_880 = (int)lVar10;
            iStack_87c = (int)((ulong)lVar10 >> 0x20);
            uVar88 = (uint)((int)local_878 < local_888) * local_888 |
                     ((int)local_878 >= local_888) * local_878;
            uVar95 = (uint)((int)uStack_874 < iStack_884) * iStack_884 |
                     ((int)uStack_874 >= iStack_884) * uStack_874;
            uVar93 = (uint)((int)uStack_870 < iStack_880) * iStack_880 |
                     ((int)uStack_870 >= iStack_880) * uStack_870;
            uVar98 = (uint)((int)uStack_86c < iStack_87c) * iStack_87c |
                     ((int)uStack_86c >= iStack_87c) * uStack_86c;
            uVar88 = ((int)uVar88 < (int)uVar78) * uVar78 | ((int)uVar88 >= (int)uVar78) * uVar88;
            uVar95 = ((int)uVar95 < (int)uVar90) * uVar90 | ((int)uVar95 >= (int)uVar90) * uVar95;
            uVar93 = ((int)uVar93 < (int)uVar92) * uVar92 | ((int)uVar93 >= (int)uVar92) * uVar93;
            uVar98 = ((int)uVar98 < (int)uVar97) * uVar97 | ((int)uVar98 >= (int)uVar97) * uVar98;
            vHM[1] = CONCAT44(uVar95,uVar88);
            vH[0] = CONCAT44(uVar98,uVar93);
            case2[1] = CONCAT44(-(uint)(uVar95 == uStack_874),-(uint)(uVar88 == local_878));
            case1[0] = CONCAT44(-(uint)(uVar98 == uStack_86c),-(uint)(uVar93 == uStack_870));
            iVar80 = -(uint)(uVar88 == uVar78);
            iVar89 = -(uint)(uVar95 == uVar90);
            iVar91 = -(uint)(uVar93 == uVar92);
            iVar96 = -(uint)(uVar98 == uVar97);
            auVar33._4_4_ = iVar89;
            auVar33._0_4_ = iVar80;
            auVar33._12_4_ = iVar96;
            auVar33._8_4_ = iVar91;
            auVar99 = pblendvb((undefined1  [16])b_00[k],register0x00001240,auVar33);
            auVar32._8_8_ = case1[0];
            auVar32._0_8_ = case2[1];
            register0x00001240 = (__m128i)pblendvb(auVar99,(undefined1  [16])b_03[k],auVar32);
            auVar31._4_4_ = iVar89;
            auVar31._0_4_ = iVar80;
            auVar31._12_4_ = iVar96;
            auVar31._8_4_ = iVar91;
            auVar99 = pblendvb((undefined1  [16])b_01[k],register0x00001240,auVar31);
            auVar30._8_8_ = case1[0];
            auVar30._0_8_ = case2[1];
            register0x00001240 = (__m128i)pblendvb(auVar99,(undefined1  [16])b_04[k],auVar30);
            auVar28._4_4_ = iVar89;
            auVar28._0_4_ = iVar80;
            auVar28._12_4_ = iVar96;
            auVar28._8_4_ = iVar91;
            auVar29._8_8_ = vFL[0];
            auVar29._0_8_ = vH[1];
            auVar99 = pblendvb((undefined1  [16])b_02[k],auVar29,auVar28);
            auVar27._8_8_ = case1[0];
            auVar27._0_8_ = case2[1];
            register0x00001240 = (__m128i)pblendvb(auVar99,(undefined1  [16])b_05[k],auVar27);
            ptr[k][0] = vHM[1];
            ptr[k][1] = vH[0];
            b_03[k][0] = vHS[1];
            b_03[k][1] = vHM[0];
            b_04[k][0] = vHL[1];
            b_04[k][1] = vHS[0];
            b_05[k][0] = vHp[1];
            b_05[k][1] = vHL[0];
            local_148 = (int)vSaturationCheckMax[1];
            iStack_144 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
            iStack_140 = (int)vSaturationCheckMin[0];
            iStack_13c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
            vSaturationCheckMax[1] =
                 CONCAT44(((int)uVar95 < iStack_144) * uVar95 |
                          (uint)((int)uVar95 >= iStack_144) * iStack_144,
                          ((int)uVar88 < local_148) * uVar88 |
                          (uint)((int)uVar88 >= local_148) * local_148);
            vSaturationCheckMin[0] =
                 CONCAT44(((int)uVar98 < iStack_13c) * uVar98 |
                          (uint)((int)uVar98 >= iStack_13c) * iStack_13c,
                          ((int)uVar93 < iStack_140) * uVar93 |
                          (uint)((int)uVar93 >= iStack_140) * iStack_140);
            local_8b8 = (int)vNegInfFront[1];
            iStack_8b4 = (int)((ulong)vNegInfFront[1] >> 0x20);
            iStack_8b0 = (int)vSaturationCheckMax[0];
            iStack_8ac = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
            uVar78 = (local_8b8 < (int)uVar88) * uVar88 |
                     (uint)(local_8b8 >= (int)uVar88) * local_8b8;
            uVar88 = (iStack_8b4 < (int)uVar95) * uVar95 |
                     (uint)(iStack_8b4 >= (int)uVar95) * iStack_8b4;
            uVar90 = (iStack_8b0 < (int)uVar93) * uVar93 |
                     (uint)(iStack_8b0 >= (int)uVar93) * iStack_8b0;
            uVar95 = (iStack_8ac < (int)uVar98) * uVar98 |
                     (uint)(iStack_8ac >= (int)uVar98) * iStack_8ac;
            local_8e8 = (int)vHS[1];
            iStack_8e4 = vHS[1]._4_4_;
            iStack_8e0 = (int)vHS[2];
            iStack_8dc = vHS[2]._4_4_;
            uVar78 = (uint)((int)uVar78 < local_8e8) * local_8e8 |
                     ((int)uVar78 >= local_8e8) * uVar78;
            uVar88 = (uint)((int)uVar88 < iStack_8e4) * iStack_8e4 |
                     ((int)uVar88 >= iStack_8e4) * uVar88;
            uVar90 = (uint)((int)uVar90 < iStack_8e0) * iStack_8e0 |
                     ((int)uVar90 >= iStack_8e0) * uVar90;
            uVar95 = (uint)((int)uVar95 < iStack_8dc) * iStack_8dc |
                     ((int)uVar95 >= iStack_8dc) * uVar95;
            local_908 = (int)vHL[1];
            iStack_904 = vHL[1]._4_4_;
            iStack_900 = (int)vHL[2];
            iStack_8fc = vHL[2]._4_4_;
            uVar78 = (uint)((int)uVar78 < local_908) * local_908 |
                     ((int)uVar78 >= local_908) * uVar78;
            uVar88 = (uint)((int)uVar88 < iStack_904) * iStack_904 |
                     ((int)uVar88 >= iStack_904) * uVar88;
            uVar90 = (uint)((int)uVar90 < iStack_900) * iStack_900 |
                     ((int)uVar90 >= iStack_900) * uVar90;
            uVar95 = (uint)((int)uVar95 < iStack_8fc) * iStack_8fc |
                     ((int)uVar95 >= iStack_8fc) * uVar95;
            iVar80 = (int)vHp[1];
            iVar89 = vHp[1]._4_4_;
            iVar91 = (int)vHp[2];
            iVar96 = vHp[2]._4_4_;
            vNegInfFront[1] =
                 CONCAT44((uint)((int)uVar88 < iVar89) * iVar89 | ((int)uVar88 >= iVar89) * uVar88,
                          (uint)((int)uVar78 < iVar80) * iVar80 | ((int)uVar78 >= iVar80) * uVar78);
            vSaturationCheckMax[0] =
                 CONCAT44((uint)((int)uVar95 < iVar96) * iVar96 | ((int)uVar95 >= iVar96) * uVar95,
                          (uint)((int)uVar90 < iVar91) * iVar91 | ((int)uVar90 >= iVar91) * uVar90);
          }
          vH[0] = ptr[iVar79][1];
          unique0x10004d48 = b_03[iVar79];
          unique0x10004d58 = b_04[iVar79];
          unique0x10004d68 = b_05[iVar79];
          vHM[1] = ptr[iVar79][0];
          for (end_query = 0; end_query < iVar71; end_query = end_query + 1) {
            vH[0] = vH[0] << 0x20 | (ulong)vHM[1] >> 0x20;
            vHM[0] = vHM[0] << 0x20 | (ulong)vHS[1] >> 0x20;
            vHS[1] = vHS[1] << 0x20;
            vHS[0] = vHS[0] << 0x20 | (ulong)vHL[1] >> 0x20;
            vHL[1] = vHL[1] << 0x20;
            vHL[0] = vHL[0] << 0x20 | (ulong)vHp[1] >> 0x20;
            vHp[1] = vHp[1] << 0x20;
            vHM[1] = vHM[1] << 0x20;
          }
          *(undefined4 *)
           (*((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->trace->
             trace_del_table + (long)s1Len * 4) = vH[0]._4_4_;
          *(undefined4 *)
           (*(long *)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix
                            )->trace->trace_del_table + 8) + (long)s1Len * 4) = vHM[0]._4_4_;
          *(undefined4 *)
           (*(long *)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix
                            )->trace->trace_del_table + 0x10) + (long)s1Len * 4) = vHS[0]._4_4_;
          *(undefined4 *)
           (*(long *)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix
                            )->trace->trace_del_table + 0x18) + (long)s1Len * 4) = vHL[0]._4_4_;
        }
        for (k = 0; k < iVar70; k = k + 1) {
          t = k * 0x10;
          vH_00[0] = (ulong)(uint)k;
          vH_00[1]._0_4_ = iVar70;
          vH_00[1]._4_4_ = 0;
          arr_store_col(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                        &profile_local->matrix)->trace->trace_del_table + 0x20),
                        vH_00,t,seglen);
          vH_01[0] = (ulong)(uint)k;
          vH_01[1]._0_4_ = iVar70;
          vH_01[1]._4_4_ = 0;
          arr_store_col(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                        &profile_local->matrix)->trace->trace_del_table + 0x28),
                        vH_01,t,seglen);
          vH_02[0] = (ulong)(uint)k;
          vH_02[1]._0_4_ = iVar70;
          vH_02[1]._4_4_ = 0;
          arr_store_col(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                        &profile_local->matrix)->trace->trace_del_table + 0x30),
                        vH_02,t,seglen);
          vH_03[0] = (ulong)(uint)k;
          vH_03[1]._0_4_ = iVar70;
          vH_03[1]._4_4_ = 0;
          arr_store_col(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                        &profile_local->matrix)->trace->trace_del_table + 0x38),
                        vH_03,t,seglen);
        }
        vH_2[0] = ptr[iVar79][1];
        vHM_2[0] = b_03[iVar79][1];
        vHS_2[0] = b_04[iVar79][1];
        vHL_2[0] = b_05[iVar79][1];
        uStack_1528 = b_05[iVar79][0];
        vHL_2[1] = b_04[iVar79][0];
        vHS_2[1] = b_03[iVar79][0];
        vHM_2[1] = ptr[iVar79][0];
        for (end_query = 0; end_query < iVar71; end_query = end_query + 1) {
          vH_2[0] = vH_2[0] << 0x20 | (ulong)vHM_2[1] >> 0x20;
          vHM_2[0] = vHM_2[0] << 0x20 | (ulong)vHS_2[1] >> 0x20;
          vHS_2[0] = vHS_2[0] << 0x20 | (ulong)vHL_2[1] >> 0x20;
          vHL_2[0] = vHL_2[0] << 0x20 | uStack_1528 >> 0x20;
          uStack_1528 = uStack_1528 << 0x20;
          vHL_2[1] = vHL_2[1] << 0x20;
          vHS_2[1] = vHS_2[1] << 0x20;
          vHM_2[1] = vHM_2[1] << 0x20;
        }
        similar = vH_2[0]._4_4_;
        length = vHM_2[0]._4_4_;
        vNegLimit[1]._4_4_ = vHS_2[0]._4_4_;
        vNegLimit[1]._0_4_ = vHL_2[0]._4_4_;
        local_108 = (int)vSaturationCheckMax[1];
        iStack_104 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
        iStack_100 = (int)vSaturationCheckMin[0];
        iStack_fc = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
        local_a18 = (int)vNegInfFront[1];
        iStack_a14 = (int)((ulong)vNegInfFront[1] >> 0x20);
        iStack_a10 = (int)vSaturationCheckMax[0];
        iStack_a0c = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
        uVar81 = CONCAT44(-(uint)(iStack_fc < local_152c),-(uint)(iStack_100 < local_152c)) |
                 CONCAT44(-(uint)(iVar72 < iStack_a0c),-(uint)(iVar72 < iStack_a10));
        auVar68._8_8_ = uVar81;
        auVar68._0_8_ =
             CONCAT44(-(uint)(iStack_104 < local_152c),-(uint)(local_108 < local_152c)) |
             CONCAT44(-(uint)(iVar72 < iStack_a14),-(uint)(iVar72 < local_a18));
        if ((((((((((((((((auVar68 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar68 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar68 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar68 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar68 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar68 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar81 >> 7 & 1) != 0) || (uVar81 >> 0xf & 1) != 0) || (uVar81 >> 0x17 & 1) != 0)
               || (uVar81 >> 0x1f & 1) != 0) || (uVar81 >> 0x27 & 1) != 0) ||
             (uVar81 >> 0x2f & 1) != 0) || (uVar81 >> 0x37 & 1) != 0) || (long)uVar81 < 0) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
          similar = 0;
          length = 0;
          vNegLimit[1]._4_4_ = 0;
          vNegLimit[1]._0_4_ = 0;
          local_1060 = 0;
          matrix._4_4_ = 0;
        }
        *(int32_t *)&profile_local->s1 = similar;
        *(int *)((long)&profile_local->s1 + 4) = local_1060;
        profile_local->s1Len = matrix._4_4_;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->matches =
             length;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->similar =
             vNegLimit[1]._4_4_;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->length =
             (int)vNegLimit[1];
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(b_05);
        parasail_free(b_04);
        parasail_free(b_03);
        parasail_free(ptr);
        parasail_free(b_02);
        parasail_free(b_01);
        parasail_free(b_00);
        parasail_free(b);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile32.score;
    pvPm = (__m128i*)profile->profile32.matches;
    pvPs = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi32(segLen), 4);
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
            vGapperL = _mm_add_epi32(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHpM = _mm_slli_si128(vHpM, 4);
        vHpS = _mm_slli_si128(vHpS, 4);
        vHpL = _mm_slli_si128(vHpL, 4);
        vHp = _mm_insert_epi32(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi32(vH, vGapO);
            vE_ext = _mm_sub_epi32(vE, vGapE);
            case1 = _mm_cmpgt_epi32(vE_opn, vE_ext);
            vE = _mm_max_epi32(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_add_epi32(vEL, vOne);
            vGapper = _mm_add_epi32(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vF, vGapper),
                    _mm_cmpeq_epi32(vF, vGapper));
            vF = _mm_max_epi32(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi32(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi32(vHp, vW);
            vHpM = _mm_add_epi32(vHpM, vWM);
            vHpS = _mm_add_epi32(vHpS, vWS);
            vHpL = _mm_add_epi32(vHpL, vOne);
            case1 = _mm_cmpgt_epi32(vE, vHp);
            vHt = _mm_max_epi32(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHtM = _mm_slli_si128(vHtM, 4);
        vHtS = _mm_slli_si128(vHtS, 4);
        vHtL = _mm_slli_si128(vHtL, 4);
        vHt = _mm_insert_epi32(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi32(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi32(vGapper, vF),
                _mm_cmpeq_epi32(vGapper, vF));
        vF = _mm_max_epi32(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_add_epi32(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            __m128i vFtM = _mm_slli_si128(vFM, 4);
            __m128i vFtS = _mm_slli_si128(vFS, 4);
            __m128i vFtL = _mm_slli_si128(vFL, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vFt, vF),
                    _mm_cmpeq_epi32(vFt, vF));
            vF = _mm_max_epi32(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_add_epi32(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vFM = _mm_slli_si128(vFM, 4);
        vFS = _mm_slli_si128(vFS, 4);
        vFL = _mm_slli_si128(vFL, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi32(vF, vHt);
        vH = _mm_max_epi32(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi32(vH, vGapO);
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_add_epi32(vFL, vOne);
            vH = _mm_max_epi32(vHp, vE);
            vH = _mm_max_epi32(vH, vF);
            case1 = _mm_cmpeq_epi32(vH, vHp);
            case2 = _mm_cmpeq_epi32(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
                vHM = _mm_slli_si128(vHM, 4);
                vHS = _mm_slli_si128(vHS, 4);
                vHL = _mm_slli_si128(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32 (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32 (vHS, 3);
            result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32 (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
        matches = (int32_t) _mm_extract_epi32 (vHM, 3);
        similar = (int32_t) _mm_extract_epi32 (vHS, 3);
        length = (int32_t) _mm_extract_epi32 (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}